

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Quaternion QVar10;
  
  fVar5 = to.z;
  fVar3 = to.x;
  fVar4 = to.y;
  fVar2 = from.z;
  fVar1 = from.x;
  fVar8 = from.y;
  fVar9 = fVar8 * fVar5 - fVar4 * fVar2;
  fVar7 = fVar2 * fVar3 - fVar5 * fVar1;
  fVar6 = fVar4 * fVar1 - fVar8 * fVar3;
  fVar8 = fVar2 * fVar5 + fVar1 * fVar3 + fVar8 * fVar4 + 1.0;
  fVar1 = fVar8 * fVar8 + fVar6 * fVar6 + fVar9 * fVar9 + fVar7 * fVar7;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = (float)(-(uint)(fVar1 == 0.0) & 0x3f800000 | ~-(uint)(fVar1 == 0.0) & (uint)(1.0 / fVar1))
  ;
  QVar10.y = fVar7 * fVar1;
  QVar10.x = fVar9 * fVar1;
  QVar10.w = fVar8 * fVar1;
  QVar10.z = fVar6 * fVar1;
  return QVar10;
}

Assistant:

RMAPI Quaternion QuaternionFromVector3ToVector3(Vector3 from, Vector3 to)
{
    Quaternion result = { 0 };

    float cos2Theta = (from.x*to.x + from.y*to.y + from.z*to.z);    // Vector3DotProduct(from, to)
    Vector3 cross = { from.y*to.z - from.z*to.y, from.z*to.x - from.x*to.z, from.x*to.y - from.y*to.x }; // Vector3CrossProduct(from, to)

    result.x = cross.x;
    result.y = cross.y;
    result.z = cross.z;
    result.w = 1.0f + cos2Theta;

    // QuaternionNormalize(q);
    // NOTE: Normalize to essentially nlerp the original and identity to 0.5
    Quaternion q = result;
    float length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}